

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

void Acb_PrintPatch(Acb_Ntk_t *pNtkF,Vec_Int_t *vDivs,Vec_Int_t *vUsed,abctime clk)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  abctime aVar5;
  uint local_34;
  int Weight;
  int iObj;
  int i;
  abctime clk_local;
  Vec_Int_t *vUsed_local;
  Vec_Int_t *vDivs_local;
  Acb_Ntk_t *pNtkF_local;
  
  local_34 = 0;
  uVar1 = Vec_IntSize(vUsed);
  printf("Patch has %d inputs: ",(ulong)uVar1);
  for (Weight = 0; iVar2 = Vec_IntSize(vUsed), Weight < iVar2; Weight = Weight + 1) {
    iVar2 = Vec_IntEntry(vUsed,Weight);
    iVar2 = Vec_IntEntry(vDivs,iVar2);
    uVar1 = Vec_IntEntry(vUsed,Weight);
    pcVar4 = Acb_ObjNameStr(pNtkF,iVar2);
    uVar3 = Acb_ObjWeight(pNtkF,iVar2);
    printf("%d=%s(w=%d) ",(ulong)uVar1,pcVar4,(ulong)uVar3);
    iVar2 = Acb_ObjWeight(pNtkF,iVar2);
    local_34 = iVar2 + local_34;
  }
  printf("\nTotal weight = %d  ",(ulong)local_34);
  aVar5 = Abc_Clock();
  Abc_PrintTime(1,"Total runtime",aVar5 - clk);
  printf("\n");
  return;
}

Assistant:

void Acb_PrintPatch( Acb_Ntk_t * pNtkF, Vec_Int_t * vDivs, Vec_Int_t * vUsed, abctime clk )
{
    int i, iObj, Weight = 0;
    printf( "Patch has %d inputs: ", Vec_IntSize(vUsed) );
    Vec_IntForEachEntryInVec( vDivs, vUsed, iObj, i )
    {
        printf( "%d=%s(w=%d) ", Vec_IntEntry(vUsed, i), Acb_ObjNameStr(pNtkF, iObj), Acb_ObjWeight(pNtkF, iObj) );
        Weight += Acb_ObjWeight(pNtkF, iObj);
    }
    printf( "\nTotal weight = %d  ", Weight );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clk );
    printf( "\n" );
}